

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O0

Roaring64Map * __thiscall roaring::Roaring64Map::operator&=(Roaring64Map *this,Roaring64Map *other)

{
  bool bVar1;
  pointer ppVar2;
  Roaring64Map *in_RSI;
  Roaring64Map *in_RDI;
  Roaring *other_bitmap;
  const_iterator other_iter;
  Roaring *self_bitmap;
  uint self_key;
  iterator self_iter;
  iterator self_next;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> in_stack_ffffffffffffff68;
  iterator in_stack_ffffffffffffff78;
  _Self local_60;
  _Self local_58;
  Roaring *local_50;
  uint local_44;
  _Base_ptr local_40;
  _Base_ptr local_38;
  _Self local_30;
  _Self local_28;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> local_20 [3];
  Roaring64Map *local_8;
  
  local_8 = in_RDI;
  if (in_RDI != in_RSI) {
    std::_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::_Rb_tree_iterator
              (local_20);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
         ::begin(in_stack_ffffffffffffff68._M_node);
    while( true ) {
      local_30._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
           ::end(in_stack_ffffffffffffff68._M_node);
      bVar1 = std::operator!=(&local_28,&local_30);
      local_8 = in_RDI;
      if (!bVar1) break;
      local_40 = local_28._M_node;
      local_38 = (_Base_ptr)
                 std::next<std::_Rb_tree_iterator<std::pair<unsigned_int_const,roaring::Roaring>>>
                           (in_stack_ffffffffffffff68,0x11ccb9);
      local_20[0] = (_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>)local_38;
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
                          0x11ccd2);
      local_44 = ppVar2->first;
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
                          0x11cce2);
      local_50 = &ppVar2->second;
      local_58._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
           ::find(in_stack_ffffffffffffff68._M_node,(key_type *)0x11ccfd);
      local_60._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
           ::end(in_stack_ffffffffffffff68._M_node);
      bVar1 = std::operator==(&local_58,&local_60);
      if (bVar1) {
        std::
        map<unsigned_int,roaring::Roaring,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,roaring::Roaring>>>
        ::erase_abi_cxx11_(&in_RDI->roarings,in_stack_ffffffffffffff78);
      }
      else {
        std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator->
                  ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
                   0x11cd53);
        Roaring::operator&=((Roaring *)in_RDI,(Roaring *)in_stack_ffffffffffffff68._M_node);
        bVar1 = Roaring::isEmpty((Roaring *)in_RDI);
        if (bVar1) {
          in_stack_ffffffffffffff78 =
               std::
               map<unsigned_int,roaring::Roaring,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,roaring::Roaring>>>
               ::erase_abi_cxx11_(&in_RDI->roarings,in_stack_ffffffffffffff78);
        }
      }
      local_28._M_node = local_20[0]._M_node;
    }
  }
  return local_8;
}

Assistant:

Roaring64Map &operator&=(const Roaring64Map &other) {
        if (this == &other) {
            // ANDing *this with itself is a no-op.
            return *this;
        }

        // Logic table summarizing what to do when a given outer key is
        // present vs. absent from self and other.
        //
        // self     other    (self & other)  work to do
        // --------------------------------------------
        // absent   absent   empty           None
        // absent   present  empty           None
        // present  absent   empty           Erase self
        // present  present  empty or not    Intersect self with other, but
        //                                   erase self if result is empty.
        //
        // Because there is only work to do when a key is present in 'self', the
        // main for loop iterates over entries in 'self'.

        decltype(roarings.begin()) self_next;
        for (auto self_iter = roarings.begin(); self_iter != roarings.end();
             self_iter = self_next) {
            // Do the 'next' operation now, so we don't have to worry about
            // invalidation of self_iter down below with the 'erase' operation.
            self_next = std::next(self_iter);

            auto self_key = self_iter->first;
            auto &self_bitmap = self_iter->second;

            auto other_iter = other.roarings.find(self_key);
            if (other_iter == other.roarings.end()) {
                // 'other' doesn't have self_key. In the logic table above,
                // this reflects the case (self.present & other.absent).
                // So, erase self.
                roarings.erase(self_iter);
                continue;
            }

            // Both sides have self_key. In the logic table above, this reflects
            // the case (self.present & other.present). So, intersect self with
            // other.
            const auto &other_bitmap = other_iter->second;
            self_bitmap &= other_bitmap;
            if (self_bitmap.isEmpty()) {
                // ...but if intersection is empty, remove it altogether.
                roarings.erase(self_iter);
            }
        }
        return *this;
    }